

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void int16_suite::test_minus_one(void)

{
  undefined4 local_58;
  value local_54 [2];
  undefined4 local_4c;
  type local_48 [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [3];
  
  decoder.current.view._M_str._5_2_ = 0xffb2;
  decoder.current.view._M_str._7_1_ = 0xff;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            ((decoder *)local_38,(uchar (*) [3])((long)&decoder.current.view._M_str + 5));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x11e,"void int16_suite::test_minus_one()",local_40,&local_44);
  local_48[0] = trial::protocol::bintoken::detail::decoder::
                value<trial::protocol::bintoken::token::int16>((decoder *)local_38);
  local_4c = 0xffffffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("decoder.value<token::int16>()","-1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x11f,"void int16_suite::test_minus_one()",local_48,&local_4c);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_54[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_58 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x121,"void int16_suite::test_minus_one()",local_54,&local_58);
  return;
}

Assistant:

void test_minus_one()
{
    const value_type input[] = { token::code::int16, 0xFF, 0xFF };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int16>(), -1);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}